

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O1

string * __thiscall
GeneratorExpressionContent::Evaluate_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer ppcVar1;
  GeneratorExpressionContent *this_00;
  int iVar2;
  cmGeneratorExpressionNode *node;
  long *plVar3;
  size_type *psVar4;
  pointer ppcVar5;
  string *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string identifier;
  undefined1 local_108 [32];
  string *local_e8;
  cmGeneratorExpressionDAGChecker *local_e0;
  string local_d8;
  string local_b8;
  GeneratorExpressionContent *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  ppcVar5 = (this->IdentifierChildren).
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->IdentifierChildren).
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = __return_storage_ptr__;
  local_e0 = dagChecker;
  local_98 = this;
  if (ppcVar5 != ppcVar1) {
    do {
      (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[3])(local_108,*ppcVar5,context,local_e0);
      std::__cxx11::string::_M_append((char *)&local_b8,local_108._0_8_);
      if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      psVar6 = local_e8;
      if (context->HadError == true) goto LAB_00389bce;
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar1);
  }
  node = cmGeneratorExpressionNode::GetNode(&local_b8);
  this_00 = local_98;
  if (node == (cmGeneratorExpressionNode *)0x0) {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,local_98->StartContent,
               local_98->StartContent + local_98->ContentLength);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Expression did not evaluate to a known generator expression","")
    ;
    psVar6 = local_e8;
    reportError(context,(string *)local_108,&local_d8);
    local_90.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    local_90._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_00389a8d:
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
LAB_00389a95:
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
  }
  else {
    iVar2 = (*node->_vptr_cmGeneratorExpressionNode[2])(node);
    if ((char)iVar2 != '\0') {
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      EvaluateParameters(&local_70,this_00,node,&local_b8,context,local_e0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_108);
      psVar6 = local_e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (context->HadError == true) {
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
      }
      else {
        (*node->_vptr_cmGeneratorExpressionNode[6])(psVar6,node,local_108,context,this_00,local_e0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      goto LAB_00389c0a;
    }
    iVar2 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
    if ((iVar2 == 1) &&
       (iVar2 = (*node->_vptr_cmGeneratorExpressionNode[4])(node), psVar6 = local_e8,
       (char)iVar2 != '\0')) {
      if ((this_00->ParamChildren).
          super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this_00->ParamChildren).
          super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,this_00->StartContent,
                   this_00->StartContent + this_00->ContentLength);
        std::operator+(&local_90,"$<",&local_b8);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_d8.field_2._M_allocated_capacity = *psVar4;
          local_d8.field_2._8_8_ = plVar3[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar4;
          local_d8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_d8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        reportError(context,(string *)local_108,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00389a8d;
        goto LAB_00389a95;
      }
    }
    else {
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      EvaluateParameters(&local_50,this_00,node,&local_b8,context,local_e0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_108);
      psVar6 = local_e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
    }
  }
LAB_00389bce:
  (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
  psVar6->_M_string_length = 0;
  (psVar6->field_2)._M_local_buf[0] = '\0';
LAB_00389c0a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return psVar6;
}

Assistant:

std::string GeneratorExpressionContent::Evaluate(
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker) const
{
  std::string identifier;
  {
    for (cmGeneratorExpressionEvaluator* pExprEval :
         this->IdentifierChildren) {
      identifier += pExprEval->Evaluate(context, dagChecker);
      if (context->HadError) {
        return std::string();
      }
    }
  }

  const cmGeneratorExpressionNode* node =
    cmGeneratorExpressionNode::GetNode(identifier);

  if (!node) {
    reportError(context, this->GetOriginalExpression(),
                "Expression did not evaluate to a known generator expression");
    return std::string();
  }

  if (!node->GeneratesContent()) {
    if (node->NumExpectedParameters() == 1 &&
        node->AcceptsArbitraryContentParameter()) {
      if (this->ParamChildren.empty()) {
        reportError(context, this->GetOriginalExpression(),
                    "$<" + identifier + "> expression requires a parameter.");
      }
    } else {
      std::vector<std::string> parameters;
      this->EvaluateParameters(node, identifier, context, dagChecker,
                               parameters);
    }
    return std::string();
  }

  std::vector<std::string> parameters;
  this->EvaluateParameters(node, identifier, context, dagChecker, parameters);
  if (context->HadError) {
    return std::string();
  }

  return node->Evaluate(parameters, context, this, dagChecker);
}